

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O3

void formatInputMethodEvent(QDebug *d,QInputMethodEvent *e)

{
  Stream *pSVar1;
  long lVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  Stream *local_90;
  QDebug local_88;
  undefined1 local_80 [16];
  anon_union_24_3_e3d07ef4_for_data local_70;
  QDebug local_58;
  QDebug local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar1 = d->stream;
  QVar3.m_data = (storage_type *)0x12;
  QVar3.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<(&pSVar1->ts,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (d->stream->space == true) {
    QTextStream::operator<<(&d->stream->ts,' ');
  }
  if ((e->m_preedit).d.size != 0) {
    pSVar1 = d->stream;
    QVar4.m_data = &DAT_00000008;
    QVar4.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<(&pSVar1->ts,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    local_50 = (QDebug)d->stream;
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
      local_50 = (QDebug)d->stream;
    }
    (local_50.stream)->ref = (local_50.stream)->ref + 1;
    formatUnicodeString(&local_50,&e->m_preedit);
    QDebug::~QDebug(&local_50);
  }
  if ((e->m_commit).d.size != 0) {
    pSVar1 = d->stream;
    QVar5.m_data = (storage_type *)0x9;
    QVar5.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<(&pSVar1->ts,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    local_58 = (QDebug)d->stream;
    if ((local_58.stream)->space == true) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      local_58 = (QDebug)d->stream;
    }
    (local_58.stream)->ref = (local_58.stream)->ref + 1;
    formatUnicodeString(&local_58,&e->m_commit);
    QDebug::~QDebug(&local_58);
  }
  if (e->m_replacementLength != 0) {
    pSVar1 = d->stream;
    QVar6.m_data = (storage_type *)0x13;
    QVar6.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<(&pSVar1->ts,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    pSVar1 = d->stream;
    if (pSVar1->space == true) {
      QTextStream::operator<<(&pSVar1->ts,' ');
      pSVar1 = d->stream;
    }
    QTextStream::operator<<(&pSVar1->ts,e->m_replacementStart);
    pSVar1 = d->stream;
    if (pSVar1->space == true) {
      QTextStream::operator<<(&pSVar1->ts,' ');
      pSVar1 = d->stream;
    }
    QVar7.m_data = (storage_type *)0x14;
    QVar7.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(&pSVar1->ts,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    pSVar1 = d->stream;
    if (pSVar1->space == true) {
      QTextStream::operator<<(&pSVar1->ts,' ');
      pSVar1 = d->stream;
    }
    QTextStream::operator<<(&pSVar1->ts,e->m_replacementLength);
    if (d->stream->space == true) {
      QTextStream::operator<<(&d->stream->ts,' ');
    }
  }
  local_70.shared = (PrivateShared *)(e->m_attributes).d.d;
  local_70._8_8_ = (e->m_attributes).d.ptr;
  lVar2 = (e->m_attributes).d.size;
  if (local_70.shared != (PrivateShared *)0x0) {
    LOCK();
    (((Data *)local_70.shared)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_70.shared)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  pSVar1 = d->stream;
  local_70._16_8_ = lVar2;
  if (lVar2 != 0) {
    QVar8.m_data = (storage_type *)0xf;
    QVar8.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<(&pSVar1->ts,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    local_80._0_8_ = d->stream;
    if (((Stream *)local_80._0_8_)->space == true) {
      QTextStream::operator<<((QTextStream *)local_80._0_8_,' ');
      local_80._0_8_ = d->stream;
    }
    ((Stream *)local_80._0_8_)->ref = ((Stream *)local_80._0_8_)->ref + 1;
    operator<<((QDebug *)(local_80 + 8),(Attribute *)local_80);
    QDebug::~QDebug((QDebug *)(local_80 + 8));
    QDebug::~QDebug((QDebug *)local_80);
    if (lVar2 != 1) {
      lVar2 = lVar2 * 0x30 + -0x30;
      do {
        QTextStream::operator<<(&d->stream->ts,',');
        pSVar1 = d->stream;
        if (pSVar1->space == true) {
          QTextStream::operator<<(&pSVar1->ts,' ');
          pSVar1 = d->stream;
        }
        pSVar1->ref = pSVar1->ref + 1;
        local_90 = pSVar1;
        operator<<(&local_88,(Attribute *)&local_90);
        QDebug::~QDebug(&local_88);
        QDebug::~QDebug((QDebug *)&local_90);
        lVar2 = lVar2 + -0x30;
      } while (lVar2 != 0);
    }
    QTextStream::operator<<(&d->stream->ts,'}');
    pSVar1 = d->stream;
    if (pSVar1->space == true) {
      QTextStream::operator<<(&pSVar1->ts,' ');
      pSVar1 = d->stream;
    }
  }
  QTextStream::operator<<(&pSVar1->ts,')');
  if (d->stream->space == true) {
    QTextStream::operator<<(&d->stream->ts,' ');
  }
  QArrayDataPointer<QInputMethodEvent::Attribute>::~QArrayDataPointer
            ((QArrayDataPointer<QInputMethodEvent::Attribute> *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void formatInputMethodEvent(QDebug d, const QInputMethodEvent *e)
{
    d << "QInputMethodEvent(";
    if (!e->preeditString().isEmpty()) {
        d << "preedit=";
        formatUnicodeString(d, e->preeditString());
    }
    if (!e->commitString().isEmpty()) {
        d << ", commit=";
        formatUnicodeString(d, e->commitString());
    }
    if (e->replacementLength()) {
        d << ", replacementStart=" << e->replacementStart() << ", replacementLength="
          << e->replacementLength();
    }
    const auto attributes = e->attributes();
    auto it = attributes.cbegin();
    const auto end = attributes.cend();
    if (it != end) {
        d << ", attributes= {";
        d << *it;
        ++it;
        for (; it != end; ++it)
            d << ',' << *it;
        d << '}';
    }
    d << ')';
}